

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

void textui_browse_object_knowledge(char *name,wchar_t row)

{
  group_funcs g_funcs;
  member_funcs o_funcs;
  _Bool _Var1;
  int *obj_list;
  wchar_t c;
  object_kind *kind;
  wchar_t i;
  wchar_t o_count;
  int *objects;
  member_funcs obj_f;
  group_funcs kind_f;
  wchar_t row_local;
  char *name_local;
  
  memcpy(&obj_f.is_visual,&PTR_kind_name_002f3fa0,0x28);
  memcpy(&objects,&PTR_display_object_002f3fc8,0x38);
  kind._4_4_ = L'\0';
  obj_list = (int *)mem_zalloc((ulong)z_info->k_max << 2);
  for (kind._0_4_ = 0; (int)kind < (int)(uint)z_info->k_max; kind._0_4_ = (int)kind + 1) {
    if (((((k_info[(int)kind].everseen & 1U) != 0) || (k_info[(int)kind].flavor != (flavor *)0x0))
        || (((player->opts).opt[0x1a] & 1U) != 0)) &&
       ((_Var1 = flag_has_dbg(k_info[(int)kind].kind_flags,4,0x12,"kind->kind_flags","KF_INSTA_ART")
        , !_Var1 && (-1 < obj_group_order[k_info[(int)kind].tval])))) {
      obj_list[kind._4_4_] = (int)kind;
      kind._4_4_ = kind._4_4_ + L'\x01';
    }
  }
  g_funcs.gcomp = (_func_wchar_t_void_ptr_void_ptr *)kind_f.name;
  g_funcs.name = (_func_char_ptr_wchar_t *)obj_f._48_8_;
  g_funcs.group = (_func_wchar_t_wchar_t *)kind_f.gcomp;
  g_funcs.summary = (_func_void_wchar_t_int_ptr_wchar_t_wchar_t_wchar_t_wchar_t *)kind_f.group;
  g_funcs._32_8_ = kind_f.summary;
  o_funcs.lore = (_func_void_wchar_t *)obj_f.display_member;
  o_funcs.display_member = (_func_void_wchar_t_wchar_t__Bool_wchar_t *)objects;
  o_funcs.xchar = (_func_wchar_t_ptr_wchar_t *)obj_f.lore;
  o_funcs.xattr = (_func_uint8_t_ptr_wchar_t *)obj_f.xchar;
  o_funcs.xtra_prompt = (_func_char_ptr_wchar_t *)obj_f.xattr;
  o_funcs.xtra_act = (_func_void_keypress_wchar_t *)obj_f.xtra_prompt;
  o_funcs._48_8_ = obj_f.xtra_act;
  display_knowledge("known objects",obj_list,kind._4_4_,g_funcs,o_funcs,
                    "Ignore  Inscribed          Sym");
  mem_free(obj_list);
  return;
}

Assistant:

void textui_browse_object_knowledge(const char *name, int row)
{
	group_funcs kind_f = {kind_name, o_cmp_tval, obj2gid, 0, TV_MAX, false};
	member_funcs obj_f = {display_object, desc_obj_fake, o_xchar, o_xattr,
						  o_xtra_prompt, o_xtra_act, 0};

	int *objects;
	int o_count = 0;
	int i;
	struct object_kind *kind;

	objects = mem_zalloc(z_info->k_max * sizeof(int));

	for (i = 0; i < z_info->k_max; i++) {
		kind = &k_info[i];
		/* It's in the list if we've ever seen it, or it has a flavour,
		 * and it's not one of the special artifacts. This way the flavour
		 * appears in the list until it is found. */
		if ((kind->everseen || kind->flavor || OPT(player, cheat_xtra)) &&
			(!kf_has(kind->kind_flags, KF_INSTA_ART))) {
			int c = obj_group_order[k_info[i].tval];
			if (c >= 0) objects[o_count++] = i;
		}
	}

	display_knowledge("known objects", objects, o_count, kind_f, obj_f,
					  "Ignore  Inscribed          Sym");

	mem_free(objects);
}